

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseTextDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputState xVar2;
  int iVar3;
  xmlChar *pxVar4;
  int c;
  int oldstate;
  xmlChar *encoding;
  xmlChar *version;
  xmlParserCtxtPtr ctxt_local;
  
  if (((((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '?')) && (ctxt->input->cur[2] == 'x')
       ) && ((ctxt->input->cur[3] == 'm' && (ctxt->input->cur[4] == 'l')))) &&
     (((ctxt->input->cur[5] == ' ' || ((8 < ctxt->input->cur[5] && (ctxt->input->cur[5] < 0xb)))) ||
      (ctxt->input->cur[5] == '\r')))) {
    ctxt->input->cur = ctxt->input->cur + 5;
    ctxt->input->col = ctxt->input->col + 5;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    xVar2 = ctxt->instate;
    ctxt->instate = XML_PARSER_START;
    iVar3 = xmlSkipBlankChars(ctxt);
    if (iVar3 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed after \'<?xml\'\n");
    }
    encoding = xmlParseVersionInfo(ctxt);
    if (encoding == (xmlChar *)0x0) {
      encoding = xmlCharStrdup("1.0");
    }
    else {
      iVar3 = xmlSkipBlankChars(ctxt);
      if (iVar3 == 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed here\n");
      }
    }
    ctxt->input->version = encoding;
    pxVar4 = xmlParseEncodingDecl(ctxt);
    if (ctxt->errNo == 0x20) {
      ctxt->instate = xVar2;
    }
    else {
      if ((pxVar4 == (xmlChar *)0x0) && (ctxt->errNo == 0)) {
        xmlFatalErrMsg(ctxt,XML_ERR_MISSING_ENCODING,"Missing encoding in text declaration\n");
      }
      xmlSkipBlankChars(ctxt);
      if ((*ctxt->input->cur == '?') && (ctxt->input->cur[1] == '>')) {
        ctxt->input->cur = ctxt->input->cur + 2;
        ctxt->input->col = ctxt->input->col + 2;
        if (*ctxt->input->cur == '\0') {
          xmlParserInputGrow(ctxt->input,0xfa);
        }
      }
      else if (*ctxt->input->cur == '>') {
        xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
        xmlNextChar(ctxt);
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
        do {
          xVar1 = *ctxt->input->cur;
          if (xVar1 == '\0') break;
          xmlNextChar(ctxt);
        } while (xVar1 != '>');
      }
      ctxt->instate = xVar2;
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_STARTED,(char *)0x0);
  }
  return;
}

Assistant:

void
xmlParseTextDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;
    const xmlChar *encoding;
    int oldstate;

    /*
     * We know that '<?xml' is here.
     */
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {
	SKIP(5);
    } else {
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_STARTED, NULL);
	return;
    }

    /* Avoid expansion of parameter entities when skipping blanks. */
    oldstate = ctxt->instate;
    ctxt->instate = XML_PARSER_START;

    if (SKIP_BLANKS == 0) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		       "Space needed after '<?xml'\n");
    }

    /*
     * We may have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL)
	version = xmlCharStrdup(XML_DEFAULT_VERSION);
    else {
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space needed here\n");
	}
    }
    ctxt->input->version = version;

    /*
     * We must have the encoding declaration
     */
    encoding = xmlParseEncodingDecl(ctxt);
    if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	/*
	 * The XML REC instructs us to stop parsing right here
	 */
        ctxt->instate = oldstate;
        return;
    }
    if ((encoding == NULL) && (ctxt->errNo == XML_ERR_OK)) {
	xmlFatalErrMsg(ctxt, XML_ERR_MISSING_ENCODING,
		       "Missing encoding in text declaration\n");
    }

    SKIP_BLANKS;
    if ((RAW == '?') && (NXT(1) == '>')) {
        SKIP(2);
    } else if (RAW == '>') {
        /* Deprecated old WD ... */
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	NEXT;
    } else {
        int c;

	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
        while ((c = CUR) != 0) {
            NEXT;
            if (c == '>')
                break;
        }
    }

    ctxt->instate = oldstate;
}